

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

void Str_MuxChangeOnce(Str_Mux_t *pTree,int *pPath,int i,int k,Str_Mux_t *pBackup,Gia_Man_t *pNew,
                      Vec_Int_t *vDelay)

{
  uint *puVar1;
  Str_Edg_t *pSVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Str_Mux_t *pSVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  
  iVar20 = i + 1;
  if (k <= iVar20) {
    __assert_fail("i + 1 < k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x609,
                  "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                 );
  }
  lVar29 = (long)k;
  lVar28 = (long)i;
  if (pBackup != (Str_Mux_t *)0x0) {
    if (pPath[lVar29] < 0) goto LAB_0072665a;
    uVar24 = (uint)pPath[lVar29] >> 1;
    pSVar19 = pTree + uVar24;
    iVar15 = pSVar19->Id;
    iVar16 = pSVar19->Delay;
    iVar17 = pSVar19->Copy;
    iVar18 = pSVar19->nLutSize;
    pSVar2 = pTree[uVar24].Edge;
    iVar11 = pSVar2->Fan;
    iVar12 = pSVar2->fCompl;
    iVar13 = pSVar2->FanDel;
    iVar14 = pSVar2->Copy;
    pSVar2 = pTree[uVar24].Edge + 1;
    iVar7 = pSVar2->Fan;
    iVar8 = pSVar2->fCompl;
    iVar9 = pSVar2->FanDel;
    iVar10 = pSVar2->Copy;
    pSVar2 = pTree[uVar24].Edge + 2;
    iVar22 = pSVar2->fCompl;
    iVar27 = pSVar2->FanDel;
    iVar6 = pSVar2->Copy;
    pBackup->Edge[2].Fan = pSVar2->Fan;
    pBackup->Edge[2].fCompl = iVar22;
    pBackup->Edge[2].FanDel = iVar27;
    pBackup->Edge[2].Copy = iVar6;
    pBackup->Edge[1].Fan = iVar7;
    pBackup->Edge[1].fCompl = iVar8;
    pBackup->Edge[1].FanDel = iVar9;
    pBackup->Edge[1].Copy = iVar10;
    pBackup->Edge[0].Fan = iVar11;
    pBackup->Edge[0].fCompl = iVar12;
    pBackup->Edge[0].FanDel = iVar13;
    pBackup->Edge[0].Copy = iVar14;
    pBackup->Id = iVar15;
    pBackup->Delay = iVar16;
    pBackup->Copy = iVar17;
    pBackup->nLutSize = iVar18;
    if (pPath[iVar20] < 0) goto LAB_0072665a;
    uVar24 = (uint)pPath[iVar20] >> 1;
    pSVar19 = pTree + uVar24;
    iVar15 = pSVar19->Id;
    iVar16 = pSVar19->Delay;
    iVar17 = pSVar19->Copy;
    iVar18 = pSVar19->nLutSize;
    pSVar2 = pTree[uVar24].Edge;
    iVar11 = pSVar2->Fan;
    iVar12 = pSVar2->fCompl;
    iVar13 = pSVar2->FanDel;
    iVar14 = pSVar2->Copy;
    pSVar2 = pTree[uVar24].Edge + 1;
    iVar7 = pSVar2->Fan;
    iVar8 = pSVar2->fCompl;
    iVar9 = pSVar2->FanDel;
    iVar10 = pSVar2->Copy;
    pSVar2 = pTree[uVar24].Edge + 2;
    iVar22 = pSVar2->fCompl;
    iVar27 = pSVar2->FanDel;
    iVar6 = pSVar2->Copy;
    pBackup[1].Edge[2].Fan = pSVar2->Fan;
    pBackup[1].Edge[2].fCompl = iVar22;
    pBackup[1].Edge[2].FanDel = iVar27;
    pBackup[1].Edge[2].Copy = iVar6;
    pBackup[1].Edge[1].Fan = iVar7;
    pBackup[1].Edge[1].fCompl = iVar8;
    pBackup[1].Edge[1].FanDel = iVar9;
    pBackup[1].Edge[1].Copy = iVar10;
    pBackup[1].Edge[0].Fan = iVar11;
    pBackup[1].Edge[0].fCompl = iVar12;
    pBackup[1].Edge[0].FanDel = iVar13;
    pBackup[1].Edge[0].Copy = iVar14;
    pBackup[1].Id = iVar15;
    pBackup[1].Delay = iVar16;
    pBackup[1].Copy = iVar17;
    pBackup[1].nLutSize = iVar18;
    if (pPath[lVar28] < 0) goto LAB_0072665a;
    uVar24 = (uint)pPath[lVar28] >> 1;
    pSVar19 = pTree + uVar24;
    iVar15 = pSVar19->Id;
    iVar16 = pSVar19->Delay;
    iVar17 = pSVar19->Copy;
    iVar18 = pSVar19->nLutSize;
    pSVar2 = pTree[uVar24].Edge;
    iVar11 = pSVar2->Fan;
    iVar12 = pSVar2->fCompl;
    iVar13 = pSVar2->FanDel;
    iVar14 = pSVar2->Copy;
    pSVar2 = pTree[uVar24].Edge + 1;
    iVar7 = pSVar2->Fan;
    iVar8 = pSVar2->fCompl;
    iVar9 = pSVar2->FanDel;
    iVar10 = pSVar2->Copy;
    pSVar2 = pTree[uVar24].Edge + 2;
    iVar22 = pSVar2->fCompl;
    iVar27 = pSVar2->FanDel;
    iVar6 = pSVar2->Copy;
    pBackup[2].Edge[2].Fan = pSVar2->Fan;
    pBackup[2].Edge[2].fCompl = iVar22;
    pBackup[2].Edge[2].FanDel = iVar27;
    pBackup[2].Edge[2].Copy = iVar6;
    pBackup[2].Edge[1].Fan = iVar7;
    pBackup[2].Edge[1].fCompl = iVar8;
    pBackup[2].Edge[1].FanDel = iVar9;
    pBackup[2].Edge[1].Copy = iVar10;
    pBackup[2].Edge[0].Fan = iVar11;
    pBackup[2].Edge[0].fCompl = iVar12;
    pBackup[2].Edge[0].FanDel = iVar13;
    pBackup[2].Edge[0].Copy = iVar14;
    pBackup[2].Id = iVar15;
    pBackup[2].Delay = iVar16;
    pBackup[2].Copy = iVar17;
    pBackup[2].nLutSize = iVar18;
  }
  uVar24 = pPath[lVar29];
  if (((-1 < (int)uVar24) && (uVar31 = pPath[iVar20], -1 < (int)uVar31)) &&
     (uVar3 = pPath[lVar28], -1 < (int)uVar3)) {
    uVar32 = (ulong)((uVar24 & 1) << 4);
    iVar22 = *(int *)((long)&pTree[uVar24 >> 1].Edge[0].Fan + uVar32);
    if (iVar22 < 1) {
      __assert_fail("pSpots[0]->Edge[pInds[0]].Fan > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                    ,0x618,
                    "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                   );
    }
    uVar26 = uVar31 >> 1;
    uVar21 = (ulong)((uVar31 & 1) << 4);
    if (*(int *)((long)&pTree[uVar26].Edge[0].Fan + uVar21) < 1) {
      __assert_fail("pSpots[1]->Edge[pInds[1]].Fan > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                    ,0x619,
                    "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                   );
    }
    uVar31 = 0;
    if (iVar20 < k) {
      lVar30 = (long)i;
      uVar31 = 0;
      do {
        uVar25 = pPath[lVar30 + 1];
        if ((int)uVar25 < 0) goto LAB_0072665a;
        uVar31 = uVar31 ^ *(uint *)((long)&pTree[uVar25 >> 1].Edge[0].fCompl +
                                   (ulong)((uVar25 & 1) << 4));
        lVar30 = lVar30 + 1;
      } while (k + -1 != (int)lVar30);
    }
    pSVar19 = pTree + (uVar3 >> 1);
    uVar23 = (ulong)((uVar3 & 1 ^ 1) << 4);
    uVar4 = *(undefined4 *)((long)&pSVar19->Edge[0].Fan + uVar23);
    uVar25 = *(uint *)((long)&pSVar19->Edge[0].fCompl + uVar23);
    uVar5 = *(undefined8 *)((long)&pSVar19->Edge[0].FanDel + uVar23);
    *(int *)((long)&pSVar19->Edge[0].Fan + uVar23) = iVar22;
    *(undefined4 *)((long)&pSVar19->Edge[0].fCompl + uVar23) = 0;
    *(int *)((long)&pTree[uVar24 >> 1].Edge[0].Fan + uVar32) = pSVar19->Id;
    *(undefined4 *)((long)&pTree[uVar26].Edge[0].Fan + uVar21) = uVar4;
    puVar1 = (uint *)((long)&pTree[uVar26].Edge[0].fCompl + uVar21);
    *puVar1 = *puVar1 ^ uVar25;
    *(undefined8 *)((long)&pTree[uVar26].Edge[0].FanDel + uVar21) = uVar5;
    if (iVar20 < k) {
      lVar30 = (long)i;
      do {
        if (pPath[lVar30 + 1] < 0) goto LAB_0072665a;
        uVar24 = pSVar19->Edge[2].FanDel;
        uVar26 = pTree[(uint)pPath[lVar30 + 1] >> 1].Edge[2].FanDel;
        iVar27 = (int)uVar24 >> 4;
        iVar22 = (int)uVar26 >> 4;
        uVar24 = uVar24 & 0xf;
        iVar20 = iVar22;
        if (iVar22 < iVar27) {
          iVar20 = iVar27;
        }
        uVar25 = 1;
        if (iVar27 < iVar22) {
          uVar24 = 1;
        }
        if (iVar27 <= iVar22) {
          uVar25 = uVar26 & 0xf;
        }
        iVar22 = 0x12;
        if ((int)(uVar24 + uVar25) <= pTree->nLutSize) {
          iVar22 = uVar24 + uVar25;
        }
        pSVar19->Edge[2].FanDel = iVar20 * 0x10 + iVar22;
        lVar30 = lVar30 + 1;
      } while (k + -1 != (int)lVar30);
    }
    if (pNew != (Gia_Man_t *)0x0) {
      uVar24 = 1;
      lVar30 = lVar28;
      if (i < k) {
        do {
          uVar26 = pPath[lVar30];
          if ((int)uVar26 < 0) goto LAB_0072665a;
          if (pTree[uVar26 >> 1].Edge[2].fCompl != 0) {
            __assert_fail("pTree[Abc_Lit2Var(pPath[c])].Edge[2].fCompl == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                          ,0x636,
                          "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                         );
          }
          uVar25 = pTree[uVar26 >> 1].Edge[2].Copy;
          if ((int)uVar25 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10f,"int Abc_LitNotCond(int, int)");
          }
          uVar24 = Gia_ManHashAnd(pNew,uVar24,uVar26 & 1 ^ uVar25 ^ 1);
          if ((int)uVar24 < 0) goto LAB_0072665a;
          Str_ObjDelay(pNew,uVar24 >> 1,pTree->nLutSize,vDelay);
          lVar30 = lVar30 + 1;
        } while (lVar29 != lVar30);
      }
      if (pPath[lVar28] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10d,"int Abc_LitIsCompl(int)");
      }
      pSVar19->Edge[2].Copy = uVar24 ^ pPath[lVar28] & 1U ^ 1;
      puVar1 = (uint *)((long)&pSVar19->Edge[0].fCompl + (ulong)((uVar3 & 1) << 4));
      *puVar1 = *puVar1 ^ uVar31;
    }
    return;
  }
LAB_0072665a:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                ,0x10c,"int Abc_Lit2Var(int)");
}

Assistant:

void Str_MuxChangeOnce( Str_Mux_t * pTree, int * pPath, int i, int k, Str_Mux_t * pBackup, Gia_Man_t * pNew, Vec_Int_t * vDelay )
{
    Str_Mux_t * pSpots[3];
    int pInds[3], MidFan, MidCom, MidDel, MidCop, c;
    int iRes, iCond, fCompl;
    // save backup
    assert( i + 1 < k );
    if ( pBackup )
    {
        pBackup[0] = pTree[ Abc_Lit2Var(pPath[k])  ];
        pBackup[1] = pTree[ Abc_Lit2Var(pPath[i+1])];
        pBackup[2] = pTree[ Abc_Lit2Var(pPath[i])  ];
    }
    // perform changes
    pSpots[0] = pTree + Abc_Lit2Var(pPath[k]); 
    pSpots[1] = pTree + Abc_Lit2Var(pPath[i+1]); 
    pSpots[2] = pTree + Abc_Lit2Var(pPath[i]); 
    pInds[0] = Abc_LitIsCompl(pPath[k]);
    pInds[1] = Abc_LitIsCompl(pPath[i+1]);
    pInds[2] = Abc_LitIsCompl(pPath[i]);
    // check
    assert( pSpots[0]->Edge[pInds[0]].Fan > 0 );
    assert( pSpots[1]->Edge[pInds[1]].Fan > 0 );
    // collect complement
    fCompl = 0;
    for ( c = i+1; c < k; c++ )
        fCompl ^= pTree[Abc_Lit2Var(pPath[c])].Edge[Abc_LitIsCompl(pPath[c])].fCompl;
    // remember bottom side
    MidFan = pSpots[2]->Edge[!pInds[2]].Fan;
    MidCom = pSpots[2]->Edge[!pInds[2]].fCompl;
    MidDel = pSpots[2]->Edge[!pInds[2]].FanDel;
    MidCop = pSpots[2]->Edge[!pInds[2]].Copy;
    // update bottom
    pSpots[2]->Edge[!pInds[2]].Fan    = pSpots[0]->Edge[pInds[0]].Fan;
    pSpots[2]->Edge[!pInds[2]].fCompl = 0;
    // update top 
    pSpots[0]->Edge[pInds[0]].Fan     = pSpots[2]->Id;
    // update middle
    pSpots[1]->Edge[pInds[1]].Fan     = MidFan;
    pSpots[1]->Edge[pInds[1]].fCompl ^= MidCom;
    pSpots[1]->Edge[pInds[1]].FanDel  = MidDel;
    pSpots[1]->Edge[pInds[1]].Copy    = MidCop;
    // update delay of the control
    for ( c = i + 1; c < k; c++ )
        pSpots[2]->Edge[2].FanDel = Str_Delay2( pSpots[2]->Edge[2].FanDel, pTree[Abc_Lit2Var(pPath[c])].Edge[2].FanDel, pTree->nLutSize );
    if ( pNew == NULL )
        return;
    // create AND gates
    iRes = 1;
    for ( c = i; c < k; c++ )
    {
        assert( pTree[Abc_Lit2Var(pPath[c])].Edge[2].fCompl == 0 );
        iCond = pTree[Abc_Lit2Var(pPath[c])].Edge[2].Copy;
        iCond = Abc_LitNotCond( iCond, !Abc_LitIsCompl(pPath[c]) );
        iRes  = Gia_ManHashAnd( pNew, iRes, iCond );
        Str_ObjDelay( pNew, Abc_Lit2Var(iRes), pTree->nLutSize, vDelay );
    }
    // complement the condition
    pSpots[2]->Edge[2].Copy = Abc_LitNotCond( iRes, !Abc_LitIsCompl(pPath[i]) );
    // complement the path
    pSpots[2]->Edge[pInds[2]].fCompl ^= fCompl;
}